

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_defer_has_queue(void)

{
  if (((task_queue_urgent.reader == task_queue_urgent.writer) &&
      ((task_queue_urgent.reader)->write == (task_queue_urgent.reader)->read)) &&
     (task_queue_normal.reader == task_queue_normal.writer)) {
    return (int)((task_queue_normal.reader)->write != (task_queue_normal.reader)->read);
  }
  return 1;
}

Assistant:

int fio_defer_has_queue(void) {
#if FIO_USE_URGENT_QUEUE
  return task_queue_urgent.reader != task_queue_urgent.writer ||
         task_queue_urgent.reader->write != task_queue_urgent.reader->read ||
         task_queue_normal.reader != task_queue_normal.writer ||
         task_queue_normal.reader->write != task_queue_normal.reader->read;
#else
  return task_queue_normal.reader != task_queue_normal.writer ||
         task_queue_normal.reader->write != task_queue_normal.reader->read;
#endif
}